

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteFixedVars
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this,
          string *namebase)

{
  pointer pcVar1;
  int iVar2;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  pcVar1 = (namebase->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + namebase->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(mp::StringFileWriter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:230:27)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(mp::StringFileWriter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:230:27)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  iVar2 = WriteStringVec2File(this,&local_58,(function<void_(mp::StringFileWriter_&)> *)&local_38);
  this->maxLen_FixName_ = iVar2;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteFixedVars(
    const std::string& namebase) {
  maxLen_FixName_ =
      WriteStringVec2File(namebase + ".fix",
                          [this](StringFileWriter& w){
      feeder_.FeedFixedVarNames(w);
});
}